

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O1

ShaderResourceDesc __thiscall
Diligent::ShaderResourcesGL::GetResourceDesc(ShaderResourcesGL *this,Uint32 Index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Uint32 UVar5;
  TextureInfo *pTVar6;
  Char *pCVar7;
  SHADER_RESOURCE_TYPE SVar8;
  ulong uVar9;
  ShaderResourceDesc SVar10;
  string _msg;
  Uint32 local_2c;
  string local_28;
  
  uVar1 = this->m_NumUniformBuffers;
  uVar2 = this->m_NumTextures;
  uVar3 = this->m_NumImages;
  uVar4 = this->m_NumStorageBlocks;
  local_2c = Index;
  if (Index < uVar3 + uVar4 + uVar2 + uVar1) {
    UVar5 = Index - uVar1;
    if (Index < uVar1) {
      pTVar6 = (TextureInfo *)GetUniformBuffer(this,Index);
    }
    else {
      local_2c = UVar5 - uVar2;
      if (UVar5 < uVar2) {
        local_2c = UVar5;
        pTVar6 = GetTexture(this,UVar5);
      }
      else {
        UVar5 = local_2c - uVar3;
        if (local_2c < uVar3) {
          pTVar6 = (TextureInfo *)GetImage(this,local_2c);
        }
        else {
          local_2c = UVar5 - uVar4;
          if (uVar4 <= UVar5) {
            FormatString<char[53]>
                      (&local_28,
                       (char (*) [53])"This should never be executed - appears to be a bug.");
            DebugAssertionFailed
                      (local_28._M_dataplus._M_p,"GetResourceDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x36f);
            goto LAB_0030350e;
          }
          local_2c = UVar5;
          pTVar6 = (TextureInfo *)GetStorageBlock(this,UVar5);
        }
      }
    }
    pCVar7 = (pTVar6->super_GLResourceAttribs).Name;
    uVar9 = (ulong)(pTVar6->super_GLResourceAttribs).ArraySize;
    SVar8 = (pTVar6->super_GLResourceAttribs).ResourceType;
  }
  else {
    FormatString<char[16],unsigned_int,char[12]>
              (&local_28,(Diligent *)"Resource index ",(char (*) [16])&local_2c,(uint *)0x809ab5,
               (char (*) [12])(ulong)uVar2);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_28._M_dataplus._M_p,0,0,0);
    }
LAB_0030350e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    uVar9 = 0;
    SVar8 = SHADER_RESOURCE_TYPE_UNKNOWN;
    pCVar7 = (Char *)0x0;
  }
  SVar10._8_8_ = (ulong)SVar8 | uVar9 << 0x20;
  SVar10.Name = pCVar7;
  return SVar10;
}

Assistant:

ShaderResourceDesc ShaderResourcesGL::GetResourceDesc(Uint32 Index) const
{
    if (Index >= GetVariableCount())
    {
        LOG_ERROR_MESSAGE("Resource index ", Index, " is invalid");
        return ShaderResourceDesc{};
    }

    if (Index < m_NumUniformBuffers)
        return GetUniformBuffer(Index).GetResourceDesc();
    else
        Index -= m_NumUniformBuffers;

    if (Index < m_NumTextures)
        return GetTexture(Index).GetResourceDesc();
    else
        Index -= m_NumTextures;

    if (Index < m_NumImages)
        return GetImage(Index).GetResourceDesc();
    else
        Index -= m_NumImages;

    if (Index < m_NumStorageBlocks)
        return GetStorageBlock(Index).GetResourceDesc();
    else
        Index -= m_NumStorageBlocks;

    UNEXPECTED("This should never be executed - appears to be a bug.");
    return ShaderResourceDesc{};
}